

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O3

bool __thiscall OpenCLEnum::enumDevices(OpenCLEnum *this)

{
  __normal_iterator<OpenCLEnum::Device_*,_std::vector<OpenCLEnum::Device,_std::allocator<OpenCLEnum::Device>_>_>
  __first;
  __normal_iterator<OpenCLEnum::Device_*,_std::vector<OpenCLEnum::Device,_std::allocator<OpenCLEnum::Device>_>_>
  __last;
  bool bVar1;
  int iVar2;
  pointer pPVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  
  iVar2 = ocl_init();
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Can\'t load OpenCL library",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  else {
    bVar1 = enumPlatforms(this);
    if (bVar1) {
      pPVar3 = (this->platforms_).
               super__Vector_base<OpenCLEnum::Platform,_std::allocator<OpenCLEnum::Platform>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->platforms_).
          super__Vector_base<OpenCLEnum::Platform,_std::allocator<OpenCLEnum::Platform>_>._M_impl.
          super__Vector_impl_data._M_finish != pPVar3) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          bVar1 = enumDevices(this,*(cl_platform_id *)((long)&pPVar3->id + lVar5));
          if (!bVar1) {
            pPVar3 = (this->platforms_).
                     super__Vector_base<OpenCLEnum::Platform,_std::allocator<OpenCLEnum::Platform>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,
                                *(char **)((long)&(pPVar3->name)._M_dataplus._M_p + lVar5),
                                *(long *)((long)&(pPVar3->name)._M_string_length + lVar5));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,": can\'t enumerate devices",0x19);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
          }
          uVar6 = uVar6 + 1;
          pPVar3 = (this->platforms_).
                   super__Vector_base<OpenCLEnum::Platform,_std::allocator<OpenCLEnum::Platform>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          lVar5 = lVar5 + 0x68;
        } while (uVar6 < (ulong)(((long)(this->platforms_).
                                        super__Vector_base<OpenCLEnum::Platform,_std::allocator<OpenCLEnum::Platform>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >>
                                 3) * 0x4ec4ec4ec4ec4ec5));
      }
      __first._M_current =
           (this->devices_).
           super__Vector_base<OpenCLEnum::Device,_std::allocator<OpenCLEnum::Device>_>._M_impl.
           super__Vector_impl_data._M_start;
      __last._M_current =
           (this->devices_).
           super__Vector_base<OpenCLEnum::Device,_std::allocator<OpenCLEnum::Device>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__first._M_current == __last._M_current) {
        return true;
      }
      uVar6 = ((long)__last._M_current - (long)__first._M_current >> 5) * -0x3333333333333333;
      lVar5 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<OpenCLEnum::Device*,std::vector<OpenCLEnum::Device,std::allocator<OpenCLEnum::Device>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(OpenCLEnum::Device_const&,OpenCLEnum::Device_const&)>>
                (__first,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_OpenCLEnum::Device_&,_const_OpenCLEnum::Device_&)>)
                 0x12a4e2);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<OpenCLEnum::Device*,std::vector<OpenCLEnum::Device,std::allocator<OpenCLEnum::Device>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(OpenCLEnum::Device_const&,OpenCLEnum::Device_const&)>>
                (__first,__last,
                 (_Iter_comp_iter<bool_(*)(const_OpenCLEnum::Device_&,_const_OpenCLEnum::Device_&)>)
                 0x12a4e2);
      return true;
    }
  }
  return false;
}

Assistant:

bool OpenCLEnum::enumDevices()
{
	if (!ocl_init()) {
		std::cerr << "Can't load OpenCL library" << std::endl;
		return false;
	}

	if (!enumPlatforms())
		return false;

	for (size_t k = 0; k < platforms_.size(); k++) {
		if (!enumDevices(platforms_[k].id)) {
			std::cerr << platforms_[k].name << ": can't enumerate devices" << std::endl;
		}
	}

	std::sort(devices_.begin(), devices_.end(), compareDevice);

	return true;
}